

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O0

void NOPN2_ChOutput(ym3438_t *chip)

{
  Bit8u BVar1;
  uint uVar2;
  bool bVar3;
  bool local_2a;
  short local_24;
  short local_22;
  Bit32u out_en;
  Bit16s sign;
  Bit16s out;
  Bit32u test_dac;
  Bit32u channel;
  Bit32u slot;
  Bit32u cycles;
  ym3438_t *chip_local;
  
  uVar2 = chip->cycles;
  _sign = chip->channel;
  BVar1 = chip->mode_test_2c[5];
  chip->ch_read = chip->ch_lock;
  if (chip->cycles < 0xc) {
    _sign = _sign + 1;
  }
  if ((uVar2 & 3) == 0) {
    if (BVar1 == '\0') {
      chip->ch_lock = chip->ch_out[_sign];
    }
    chip->ch_lock_l = chip->pan_l[_sign];
    chip->ch_lock_r = chip->pan_r[_sign];
  }
  if (((uVar2 >> 2 == 1) && (chip->dacen != '\0')) || (BVar1 != '\0')) {
    local_22 = (chip->dacdata & 0xffU) - (chip->dacdata & 0x100U);
  }
  else {
    local_22 = chip->ch_lock;
  }
  chip->mol = 0;
  chip->mor = 0;
  if ((chip->chip_type & 1) == 0) {
    bVar3 = (uVar2 & 3) != 0;
    local_2a = bVar3 || BVar1 != '\0';
    if ((chip->ch_lock_l != '\0') && (bVar3 || BVar1 != '\0')) {
      chip->mol = local_22;
    }
    if ((chip->ch_lock_r != '\0') && (local_2a)) {
      chip->mor = local_22;
    }
  }
  else {
    bVar3 = (uVar2 & 3) != 3;
    local_24 = (short)(char)((ushort)local_22 >> 8);
    if (-1 < local_22) {
      local_22 = local_22 + 1;
      local_24 = local_24 + 1;
    }
    if ((chip->ch_lock_l == '\0') || (bVar3 && BVar1 == '\0')) {
      chip->mol = local_24;
    }
    else {
      chip->mol = local_22;
    }
    if ((chip->ch_lock_r == '\0') || (bVar3 && BVar1 == '\0')) {
      chip->mor = local_24;
    }
    else {
      chip->mor = local_22;
    }
    chip->mol = chip->mol * 3;
    chip->mor = chip->mor * 3;
  }
  return;
}

Assistant:

static void NOPN2_ChOutput(ym3438_t *chip)
{
    Bit32u cycles = chip->cycles;
    Bit32u slot = chip->cycles;
    Bit32u channel = chip->channel;
    Bit32u test_dac = chip->mode_test_2c[5];
    Bit16s out;
    Bit16s sign;
    Bit32u out_en;
    chip->ch_read = chip->ch_lock;
    if (slot < 12)
    {
        /* Ch 4,5,6 */
        channel++;
    }
    if ((cycles & 3) == 0)
    {
        if (!test_dac)
        {
            /* Lock value */
            chip->ch_lock = chip->ch_out[channel];
        }
        chip->ch_lock_l = chip->pan_l[channel];
        chip->ch_lock_r = chip->pan_r[channel];
    }
    /* Ch 6 */
    if (((cycles >> 2) == 1 && chip->dacen) || test_dac)
    {
        out = (Bit16s)chip->dacdata;
        out = SIGN_EXTEND(8, out);
    }
    else
    {
        out = chip->ch_lock;
    }
    chip->mol = 0;
    chip->mor = 0;

    if (chip->chip_type & ym3438_mode_ym2612)
    {
        out_en = ((cycles & 3) == 3) || test_dac;
        /* YM2612 DAC emulation(not verified) */
        sign = out >> 8;
        if (out >= 0)
        {
            out++;
            sign++;
        }
        if (chip->ch_lock_l && out_en)
        {
            chip->mol = out;
        }
        else
        {
            chip->mol = sign;
        }
        if (chip->ch_lock_r && out_en)
        {
            chip->mor = out;
        }
        else
        {
            chip->mor = sign;
        }
        /* Amplify signal */
        chip->mol *= 3;
        chip->mor *= 3;
    }
    else
    {
        out_en = ((cycles & 3) != 0) || test_dac;
        if (chip->ch_lock_l && out_en)
        {
            chip->mol = out;
        }
        if (chip->ch_lock_r && out_en)
        {
            chip->mor = out;
        }
    }
}